

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>,_bool>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::InnerMap::insert(pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>,_bool>
                   *__return_storage_ptr__,InnerMap *this,KeyValuePair *kv)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool local_a1;
  undefined1 local_a0 [8];
  iterator result;
  Node *node;
  size_type b;
  bool local_51;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  local_50;
  undefined1 local_38 [8];
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>,_unsigned_long>
  p;
  KeyValuePair *kv_local;
  InnerMap *this_local;
  
  p.second = (unsigned_long)kv;
  pbVar2 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::KeyValuePair::key(kv);
  FindHelper((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>,_unsigned_long>
              *)local_38,this,pbVar2);
  if (local_38 == (undefined1  [8])0x0) {
    bVar1 = ResizeIfLoadIsOutOfRange(this,this->num_elements_ + 1);
    if (bVar1) {
      pbVar2 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::KeyValuePair::key((KeyValuePair *)p.second);
      FindHelper((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>,_unsigned_long>
                  *)&b,this,pbVar2);
      std::
      pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>,_unsigned_long>
      ::operator=((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>,_unsigned_long>
                   *)local_38,(type)&b);
    }
    result.bucket_index_ =
         (size_type)
         Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::
         Alloc<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::Node>
                   ((InnerMap *)this,1);
    Map<std::__cxx11::string,std::__cxx11::string>::
    MapAllocator<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::KeyValuePair>::
    construct<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::KeyValuePair,google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::KeyValuePair_const&>
              ((MapAllocator<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::KeyValuePair>
                *)&this->alloc_,(KeyValuePair *)result.bucket_index_,(KeyValuePair *)p.second);
    InsertUnique((iterator *)local_a0,this,p.first.bucket_index_,(Node *)result.bucket_index_);
    this->num_elements_ = this->num_elements_ + 1;
    local_a1 = true;
    std::
    make_pair<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::KeyValuePair>&,bool>
              (__return_storage_ptr__,
               (iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
                *)local_a0,&local_a1);
  }
  else {
    Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::
    iterator_base<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::KeyValuePair>::
    iterator_base<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::KeyValuePair_const>
              ((iterator_base<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::KeyValuePair>
                *)&local_50,
               (iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
                *)local_38);
    local_51 = false;
    std::
    make_pair<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::KeyValuePair>,bool>
              (__return_storage_ptr__,&local_50,&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const KeyValuePair& kv) {
      std::pair<const_iterator, size_type> p = FindHelper(kv.key());
      // Case 1: key was already present.
      if (p.first.node_ != NULL)
        return std::make_pair(iterator(p.first), false);
      // Case 2: insert.
      if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
        p = FindHelper(kv.key());
      }
      const size_type b = p.second;  // bucket number
      Node* node = Alloc<Node>(1);
      alloc_.construct(&node->kv, kv);
      iterator result = InsertUnique(b, node);
      ++num_elements_;
      return std::make_pair(result, true);
    }